

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>
          (JSONWriter *this,basic_string_view<char,_std::char_traits<char>_> value)

{
  ostream *poVar1;
  char *in_RCX;
  string_view value_00;
  string local_40;
  JSONWriter *local_20;
  JSONWriter *this_local;
  basic_string_view<char,_std::char_traits<char>_> value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (JSONWriter *)value._M_len;
  local_20 = this;
  poVar1 = std::operator<<((ostream *)&(this->s_).field_0x10,'\"');
  value_00._M_str = in_RCX;
  value_00._M_len = value_local._M_len;
  escape_abi_cxx11_(&local_40,this_local,value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,'\"');
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<((ostream *)&(this->s_).field_0x10,',');
  return this;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }